

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool absl::str_format_internal::anon_unknown_3::
     ConvertAll<absl::str_format_internal::(anonymous_namespace)::DefaultConverter>
               (UntypedFormatSpecImpl format,
               Span<const_absl::str_format_internal::FormatArgImpl> args,DefaultConverter converter)

{
  ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter> consumer;
  ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter> consumer_00;
  Span<const_absl::str_format_internal::FormatArgImpl> pack;
  Span<const_absl::str_format_internal::FormatArgImpl> pack_00;
  bool bVar1;
  ParsedFormatBase *this;
  ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter> local_90;
  string_view local_78;
  FormatSinkImpl *local_68;
  pointer local_60;
  FormatSinkImpl *local_58;
  ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter> local_50;
  DefaultConverter local_38;
  DefaultConverter converter_local;
  Span<const_absl::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  
  args_local.ptr_ = (pointer)args.len_;
  converter_local.sink_ = (FormatSinkImpl *)args.ptr_;
  args_local.len_ = (size_type)format.data_;
  local_38.sink_ = converter.sink_;
  bVar1 = UntypedFormatSpecImpl::has_parsed_conversion((UntypedFormatSpecImpl *)&args_local.len_);
  if (bVar1) {
    this = UntypedFormatSpecImpl::parsed_conversion((UntypedFormatSpecImpl *)&args_local.len_);
    local_58 = local_38.sink_;
    local_68 = converter_local.sink_;
    local_60 = args_local.ptr_;
    pack_00.len_ = (size_type)args_local.ptr_;
    pack_00.ptr_ = (pointer)converter_local.sink_;
    ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter>::
    ConverterConsumer(&local_50,local_38,pack_00);
    consumer.arg_context_.pack_.ptr_ = local_50.arg_context_.pack_.ptr_;
    consumer.converter_.sink_ = local_50.converter_.sink_;
    consumer.arg_context_.pack_.len_ = local_50.arg_context_.pack_.len_;
    format_local.size_._7_1_ =
         ParsedFormatBase::
         ProcessFormat<absl::str_format_internal::(anonymous_namespace)::ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter>>
                   (this,consumer);
  }
  else {
    local_78 = UntypedFormatSpecImpl::str((UntypedFormatSpecImpl *)&args_local.len_);
    pack.len_ = (size_type)args_local.ptr_;
    pack.ptr_ = (pointer)converter_local.sink_;
    ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter>::
    ConverterConsumer(&local_90,local_38,pack);
    consumer_00.arg_context_.pack_.ptr_ = local_90.arg_context_.pack_.ptr_;
    consumer_00.converter_.sink_ = local_90.converter_.sink_;
    consumer_00.arg_context_.pack_.len_ = local_90.arg_context_.pack_.len_;
    format_local.size_._7_1_ =
         ParseFormatString<absl::str_format_internal::(anonymous_namespace)::ConverterConsumer<absl::str_format_internal::(anonymous_namespace)::DefaultConverter>>
                   (local_78,consumer_00);
  }
  return format_local.size_._7_1_;
}

Assistant:

bool ConvertAll(const UntypedFormatSpecImpl format,
                absl::Span<const FormatArgImpl> args, Converter converter) {
  if (format.has_parsed_conversion()) {
    return format.parsed_conversion()->ProcessFormat(
        ConverterConsumer<Converter>(converter, args));
  } else {
    return ParseFormatString(format.str(),
                             ConverterConsumer<Converter>(converter, args));
  }
}